

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O3

void lwsl_hexdump_level(int hexdump_level,void *vbuf,size_t len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  char line [80];
  ulong local_a0;
  char local_88 [88];
  
  if ((log_level & hexdump_level) != 0) {
    if (len == 0) {
      _lws_log(hexdump_level,"(hexdump: zero length)\n");
      return;
    }
    if (vbuf == (void *)0x0) {
      _lws_log(hexdump_level,"(hexdump: trying to dump %d at NULL)\n",len & 0xffffffff);
      return;
    }
    _lws_log(hexdump_level,"\n");
    local_a0 = 0;
    do {
      iVar1 = lws_snprintf(local_88,10,"%04X: ",local_a0);
      pcVar7 = local_88 + iVar1;
      iVar1 = (int)local_a0;
      if (local_a0 < len) {
        uVar9 = 0;
        do {
          uVar8 = uVar9;
          iVar2 = lws_snprintf(pcVar7,5,"%02X ",(ulong)*(byte *)((long)vbuf + local_a0));
          pcVar7 = pcVar7 + iVar2;
          uVar9 = uVar8 + 1;
          if (0xe < uVar8) break;
          local_a0 = (ulong)(uVar8 + iVar1 + 1);
        } while (local_a0 < len);
        local_a0 = (ulong)(iVar1 + uVar9);
        if (uVar8 < 0xf) goto LAB_001102f2;
      }
      else {
        uVar9 = 0;
LAB_001102f2:
        iVar2 = uVar9 - 0x10;
        do {
          iVar3 = lws_snprintf(pcVar7,5,"   ");
          pcVar7 = pcVar7 + iVar3;
          iVar2 = iVar2 + 1;
        } while (iVar2 != 0);
      }
      iVar2 = lws_snprintf(pcVar7,6,"   ");
      uVar4 = 0;
      do {
        uVar6 = (ulong)(uint)(iVar1 + (int)uVar4);
        if (len <= uVar6) {
          pcVar7 = pcVar7 + uVar4 + (long)iVar2;
          if (uVar4 < 0x10) {
            memset(pcVar7,0x20,0x10 - uVar4);
            pcVar7 = pcVar7 + (0x10 - uVar4);
          }
          goto LAB_00110392;
        }
        cVar5 = *(char *)((long)vbuf + uVar6);
        if (0x5e < (byte)(cVar5 - 0x20U)) {
          cVar5 = '.';
        }
        pcVar7[uVar4 + (long)iVar2] = cVar5;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x10);
      pcVar7 = pcVar7 + (long)iVar2 + 0x10;
LAB_00110392:
      pcVar7[0] = '\n';
      pcVar7[1] = '\0';
      _lws_log(hexdump_level,"%s",local_88);
    } while (local_a0 < len);
    _lws_log(hexdump_level,"\n");
  }
  return;
}

Assistant:

void
lwsl_hexdump_level(int hexdump_level, const void *vbuf, size_t len)
{
	unsigned char *buf = (unsigned char *)vbuf;
	unsigned int n;

	if (!lwsl_visible(hexdump_level))
		return;

	if (!len) {
		_lws_log(hexdump_level, "(hexdump: zero length)\n");
		return;
	}

	if (!vbuf) {
		_lws_log(hexdump_level, "(hexdump: trying to dump %d at NULL)\n",
					(int)len);
		return;
	}

	_lws_log(hexdump_level, "\n");

	for (n = 0; n < len;) {
		unsigned int start = n, m;
		char line[80], *p = line;

		p += lws_snprintf(p, 10, "%04X: ", start);

		for (m = 0; m < 16 && n < len; m++)
			p += lws_snprintf(p, 5, "%02X ", buf[n++]);
		while (m++ < 16)
			p += lws_snprintf(p, 5, "   ");

		p += lws_snprintf(p, 6, "   ");

		for (m = 0; m < 16 && (start + m) < len; m++) {
			if (buf[start + m] >= ' ' && buf[start + m] < 127)
				*p++ = buf[start + m];
			else
				*p++ = '.';
		}
		while (m++ < 16)
			*p++ = ' ';

		*p++ = '\n';
		*p = '\0';
		_lws_log(hexdump_level, "%s", line);
		(void)line;
	}

	_lws_log(hexdump_level, "\n");
}